

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

int __thiscall
EventDispatcherHelper::removeEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  Node *pNVar1;
  EventListenerNode *pEVar2;
  Node *pNVar3;
  AutoLock _auto_lock_;
  
  AutoLock::AutoLock(&_auto_lock_,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x74);
  pNVar3 = (this->mEventList).mHead;
  pNVar1 = (this->mEventList).mTail;
  do {
    pNVar3 = pNVar3->next;
    if (pNVar3 == pNVar1) goto LAB_001174aa;
    pEVar2 = pNVar3->val;
  } while ((pEVar2->mEventId != event_id) || (pEVar2->mListener != listener));
  pEVar2->mListener = (IEventListener *)0x0;
LAB_001174aa:
  AutoLock::~AutoLock(&_auto_lock_);
  return -(uint)(pNVar3 == pNVar1);
}

Assistant:

int EventDispatcherHelper::removeEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		EventListenerNode *lnode = *i;
		
		if ( lnode->mEventId == event_id && lnode->mListener == listener )
		{
			// Update mListener 
			lnode->mListener = NULL;
			return 0;
		}
	}

	// Didn't find it
	return -1;
}